

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::ensurePlainTextEdit(QInputDialogPrivate *this)

{
  QWidget *parent;
  QPlainTextEdit *this_00;
  QWidgetPrivate *pQVar1;
  long in_FS_OFFSET;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->plainTextEdit == (QPlainTextEdit *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    this_00 = (QPlainTextEdit *)operator_new(0x28);
    QPlainTextEdit::QPlainTextEdit(this_00,parent);
    this->plainTextEdit = this_00;
    QPlainTextEdit::setLineWrapMode(this_00,NoWrap);
    pQVar1 = qt_widget_private((QWidget *)this->plainTextEdit);
    pQVar1->field_0x253 = pQVar1->field_0x253 | 4;
    QWidget::hide((QWidget *)this->plainTextEdit);
    QObjectPrivate::connect<void(QPlainTextEdit::*)(),void(QInputDialogPrivate::*)()>
              ((Object *)&stack0xffffffffffffffd8,
               (offset_in_QPlainTextEdit_to_subr)this->plainTextEdit,
               (Object *)QPlainTextEdit::textChanged,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensurePlainTextEdit()
{
    Q_Q(QInputDialog);
    if (!plainTextEdit) {
        plainTextEdit = new QPlainTextEdit(q);
        plainTextEdit->setLineWrapMode(QPlainTextEdit::NoWrap);
#ifndef QT_NO_IM
        qt_widget_private(plainTextEdit)->inheritsInputMethodHints = 1;
#endif
        plainTextEdit->hide();
        QObjectPrivate::connect(plainTextEdit, &QPlainTextEdit::textChanged,
                                this, &QInputDialogPrivate::plainTextEditTextChanged);
    }
}